

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int nrTests;
  char **argv_local;
  int argc_local;
  
  printf("Mapcode C Library Unit Tests\n");
  printf("Library version %s (data version %s)\n","2.5.5","2.3.0");
  printf("Using up to %d threads to test in parallel...\n",0x10);
  if ((argc == 1) && (argv != (char **)0x0)) {
    printf("-----------------------------------------------------------\nEnvironment tests\n");
    iVar1 = testEnvironment();
    printf("-----------------------------------------------------------\nRobustness tests\n");
    iVar2 = testRobustness();
    printf("-----------------------------------------------------------\nAlphabet tests\n");
    iVar3 = testAlphabetRobustness();
    iVar4 = testAlphabets();
    printf(
          "-----------------------------------------------------------\nAlphabet per territory tests\n"
          );
    iVar5 = testAlphabetPerTerritory();
    printf("-----------------------------------------------------------\nParser tests\n");
    iVar6 = testAlphabetParser();
    printf("-----------------------------------------------------------\nTerritory name tests\n");
    iVar7 = testGetFullTerritoryName();
    printf("-----------------------------------------------------------\nTerritory tests\n");
    iVar8 = testTerritoriesCsv();
    iVar9 = testTerritories();
    iVar10 = testTerritoryCode();
    iVar11 = testTerritoryInsides();
    printf("-----------------------------------------------------------\nDistance tests\n");
    iVar12 = testDistances();
    printf("-----------------------------------------------------------\nMapcode format tests\n");
    iVar13 = testMapcodeFormats();
    iVar14 = testFailingDecodes();
    printf("-----------------------------------------------------------\nEncode/decode tests\n");
    iVar15 = testSingleEncodes();
    iVar16 = testSelectedEncodes();
    iVar17 = testEncodeDecode();
    printf("-----------------------------------------------------------\nRe-encode tests\n");
    iVar18 = testReEncode();
    printf("-----------------------------------------------------------\n");
    printf("Done.\nExecuted %d tests, found %d errors\n",
           (ulong)(uint)(iVar18 + iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + 
                                                  iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar4 + iVar3 + iVar2 + iVar1),
           (ulong)(uint)nrErrors);
    if (nrErrors < 1) {
      printf("Unit tests passed\n");
    }
    else {
      printf("UNIT TESTS FAILED!\n");
    }
    return nrErrors;
  }
  printf("*** ERROR *** unittest takes no arguments!\n");
  exit(1);
}

Assistant:

int main(const int argc, const char **argv) {
    int nrTests = 0;

    // Ref unused var.
    REF(ISO3166_ALPHA[0]);

    printf("Mapcode C Library Unit Tests\n");
    printf("Library version %s (data version %s)\n", MAPCODE_C_VERSION, MAPCODE_DATA_VERSION);
#ifdef NO_POSIX_THREADS
    printf("Compiler options: NO_POSIX_THREADS\n");
#else
    printf("Using up to %d threads to test in parallel...\n", MAX_THREADS);
#endif

    if (argc != 1 || argv == NULL) {
        printf("*** ERROR *** unittest takes no arguments!\n");
        exit(1);
    }

    printf("-----------------------------------------------------------\nEnvironment tests\n");
    nrTests += testEnvironment();

    printf("-----------------------------------------------------------\nRobustness tests\n");
    nrTests += testRobustness();

    printf("-----------------------------------------------------------\nAlphabet tests\n");
    nrTests += testAlphabetRobustness();
    nrTests += testAlphabets();

    printf("-----------------------------------------------------------\nAlphabet per territory tests\n");
    nrTests += testAlphabetPerTerritory();

    printf("-----------------------------------------------------------\nParser tests\n");
    nrTests += testAlphabetParser();

    printf("-----------------------------------------------------------\nTerritory name tests\n");
    nrTests += testGetFullTerritoryName();

    printf("-----------------------------------------------------------\nTerritory tests\n");
    nrTests += testTerritoriesCsv();
    nrTests += testTerritories();
    nrTests += testTerritoryCode();
    nrTests += testTerritoryInsides();

    printf("-----------------------------------------------------------\nDistance tests\n");
    nrTests += testDistances();

    printf("-----------------------------------------------------------\nMapcode format tests\n");
    nrTests += testMapcodeFormats();
    nrTests += testFailingDecodes();

    printf("-----------------------------------------------------------\nEncode/decode tests\n");
    nrTests += testSingleEncodes();
    nrTests += testSelectedEncodes();
    nrTests += testEncodeDecode();

    printf("-----------------------------------------------------------\nRe-encode tests\n");
    nrTests += testReEncode();

    printf("-----------------------------------------------------------\n");
    printf("Done.\nExecuted %d tests, found %d errors\n", nrTests, nrErrors);
    if (nrErrors > 0) {
        printf("UNIT TESTS FAILED!\n");
    } else {
        printf("Unit tests passed\n");
    }
    return nrErrors;
}